

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

array<Centaurus::CharClass<unsigned_char>,_3UL> * __thiscall
Centaurus::CharClass<unsigned_char>::diff_and_int
          (array<Centaurus::CharClass<unsigned_char>,_3UL> *__return_storage_ptr__,
          CharClass<unsigned_char> *this,CharClass<unsigned_char> *cc)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  uchar uVar5;
  reference pvVar6;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  *p_Var7;
  reference pRVar8;
  bool local_141;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_128;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_120;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_118;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_110;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_108;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_100;
  Range<unsigned_char> local_f8;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_e8;
  Range<unsigned_char> local_e0;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_d0;
  Range<unsigned_char> local_c8;
  Range<unsigned_char> local_b8;
  Range<unsigned_char> local_a8;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_98;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_90;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_88;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_80;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_78;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_70;
  undefined1 local_68 [8];
  Range<unsigned_char> rj;
  undefined1 local_48 [8];
  Range<unsigned_char> ri;
  const_iterator j;
  const_iterator i;
  CharClass<unsigned_char> *cc_local;
  CharClass<unsigned_char> *this_local;
  array<Centaurus::CharClass<unsigned_char>,_3UL> *ret;
  
  std::array<Centaurus::CharClass<unsigned_char>,_3UL>::array(__return_storage_ptr__);
  j = std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      cbegin(&this->m_ranges);
  ri._8_8_ = std::
             vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ::cbegin(&cc->m_ranges);
  Range<unsigned_char>::Range((Range<unsigned_char> *)local_48);
  Range<unsigned_char>::Range((Range<unsigned_char> *)local_68);
  local_70._M_current =
       (Range<unsigned_char> *)
       std::
       vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
       cend(&this->m_ranges);
  bVar1 = __gnu_cxx::operator!=(&j,&local_70);
  if (bVar1) {
    pRVar8 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator*(&j);
    Range<unsigned_char>::operator=((Range<unsigned_char> *)local_48,pRVar8);
  }
  local_78._M_current =
       (Range<unsigned_char> *)
       std::
       vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
       cend(&cc->m_ranges);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                      *)&ri.m_start,&local_78);
  if (bVar1) {
    pRVar8 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator*((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                          *)&ri.m_start);
    Range<unsigned_char>::operator=((Range<unsigned_char> *)local_68,pRVar8);
  }
  while( true ) {
    local_80._M_current =
         (Range<unsigned_char> *)
         std::
         vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ::cend(&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&j,&local_80);
    local_141 = false;
    if (bVar1) {
      local_88._M_current =
           (Range<unsigned_char> *)
           std::
           vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ::cend(&cc->m_ranges);
      local_141 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                              *)&ri.m_start,&local_88);
    }
    if (local_141 == false) break;
    bVar1 = Range<unsigned_char>::operator<
                      ((Range<unsigned_char> *)local_48,(Range<unsigned_char> *)local_68);
    if (bVar1) {
      pvVar6 = std::array<Centaurus::CharClass<unsigned_char>,_3UL>::operator[]
                         (__return_storage_ptr__,0);
      append(pvVar6,(Range<unsigned_char> *)local_48);
      p_Var7 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
               ::operator++(&j);
      local_90._M_current =
           (Range<unsigned_char> *)
           std::
           vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ::cend(&this->m_ranges);
      bVar1 = __gnu_cxx::operator!=(p_Var7,&local_90);
      if (bVar1) {
        pRVar8 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                 ::operator*(&j);
        Range<unsigned_char>::operator=((Range<unsigned_char> *)local_48,pRVar8);
      }
    }
    else {
      bVar1 = Range<unsigned_char>::operator>
                        ((Range<unsigned_char> *)local_48,(Range<unsigned_char> *)local_68);
      if (bVar1) {
        pvVar6 = std::array<Centaurus::CharClass<unsigned_char>,_3UL>::operator[]
                           (__return_storage_ptr__,1);
        append(pvVar6,(Range<unsigned_char> *)local_68);
        p_Var7 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                 ::operator++((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                               *)&ri.m_start);
        local_98._M_current =
             (Range<unsigned_char> *)
             std::
             vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ::cend(&cc->m_ranges);
        bVar1 = __gnu_cxx::operator!=(p_Var7,&local_98);
        if (bVar1) {
          pRVar8 = __gnu_cxx::
                   __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                   ::operator*((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                *)&ri.m_start);
          Range<unsigned_char>::operator=((Range<unsigned_char> *)local_68,pRVar8);
        }
      }
      else {
        bVar2 = Range<unsigned_char>::start((Range<unsigned_char> *)local_48);
        bVar3 = Range<unsigned_char>::start((Range<unsigned_char> *)local_68);
        if (bVar2 < bVar3) {
          pvVar6 = std::array<Centaurus::CharClass<unsigned_char>,_3UL>::operator[]
                             (__return_storage_ptr__,0);
          uVar4 = Range<unsigned_char>::start((Range<unsigned_char> *)local_48);
          uVar5 = Range<unsigned_char>::start((Range<unsigned_char> *)local_68);
          Range<unsigned_char>::Range(&local_a8,uVar4,uVar5);
          append(pvVar6,&local_a8);
          Range<unsigned_char>::~Range(&local_a8);
          uVar4 = Range<unsigned_char>::start((Range<unsigned_char> *)local_68);
          Range<unsigned_char>::start((Range<unsigned_char> *)local_48,uVar4);
        }
        else {
          bVar2 = Range<unsigned_char>::start((Range<unsigned_char> *)local_68);
          bVar3 = Range<unsigned_char>::start((Range<unsigned_char> *)local_48);
          if (bVar2 < bVar3) {
            pvVar6 = std::array<Centaurus::CharClass<unsigned_char>,_3UL>::operator[]
                               (__return_storage_ptr__,1);
            uVar4 = Range<unsigned_char>::start((Range<unsigned_char> *)local_68);
            uVar5 = Range<unsigned_char>::start((Range<unsigned_char> *)local_48);
            Range<unsigned_char>::Range(&local_b8,uVar4,uVar5);
            append(pvVar6,&local_b8);
            Range<unsigned_char>::~Range(&local_b8);
            uVar4 = Range<unsigned_char>::start((Range<unsigned_char> *)local_48);
            Range<unsigned_char>::start((Range<unsigned_char> *)local_68,uVar4);
          }
          else {
            bVar2 = Range<unsigned_char>::end((Range<unsigned_char> *)local_48);
            bVar3 = Range<unsigned_char>::end((Range<unsigned_char> *)local_68);
            if (bVar3 < bVar2) {
              pvVar6 = std::array<Centaurus::CharClass<unsigned_char>,_3UL>::operator[]
                                 (__return_storage_ptr__,2);
              uVar4 = Range<unsigned_char>::start((Range<unsigned_char> *)local_68);
              uVar5 = Range<unsigned_char>::end((Range<unsigned_char> *)local_68);
              Range<unsigned_char>::Range(&local_c8,uVar4,uVar5);
              append(pvVar6,&local_c8);
              Range<unsigned_char>::~Range(&local_c8);
              uVar4 = Range<unsigned_char>::end((Range<unsigned_char> *)local_68);
              Range<unsigned_char>::start((Range<unsigned_char> *)local_48,uVar4);
              p_Var7 = __gnu_cxx::
                       __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                       ::operator++((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                     *)&ri.m_start);
              local_d0._M_current =
                   (Range<unsigned_char> *)
                   std::
                   vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                   ::cend(&cc->m_ranges);
              bVar1 = __gnu_cxx::operator!=(p_Var7,&local_d0);
              if (bVar1) {
                pRVar8 = __gnu_cxx::
                         __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                         ::operator*((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                      *)&ri.m_start);
                Range<unsigned_char>::operator=((Range<unsigned_char> *)local_68,pRVar8);
              }
            }
            else {
              bVar2 = Range<unsigned_char>::end((Range<unsigned_char> *)local_48);
              bVar3 = Range<unsigned_char>::end((Range<unsigned_char> *)local_68);
              if (bVar2 < bVar3) {
                pvVar6 = std::array<Centaurus::CharClass<unsigned_char>,_3UL>::operator[]
                                   (__return_storage_ptr__,2);
                uVar4 = Range<unsigned_char>::start((Range<unsigned_char> *)local_48);
                uVar5 = Range<unsigned_char>::end((Range<unsigned_char> *)local_48);
                Range<unsigned_char>::Range(&local_e0,uVar4,uVar5);
                append(pvVar6,&local_e0);
                Range<unsigned_char>::~Range(&local_e0);
                uVar4 = Range<unsigned_char>::end((Range<unsigned_char> *)local_48);
                Range<unsigned_char>::start((Range<unsigned_char> *)local_68,uVar4);
                p_Var7 = __gnu_cxx::
                         __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                         ::operator++(&j);
                local_e8._M_current =
                     (Range<unsigned_char> *)
                     std::
                     vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                     ::cend(&this->m_ranges);
                bVar1 = __gnu_cxx::operator!=(p_Var7,&local_e8);
                if (bVar1) {
                  pRVar8 = __gnu_cxx::
                           __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                           ::operator*(&j);
                  Range<unsigned_char>::operator=((Range<unsigned_char> *)local_48,pRVar8);
                }
              }
              else {
                pvVar6 = std::array<Centaurus::CharClass<unsigned_char>,_3UL>::operator[]
                                   (__return_storage_ptr__,2);
                uVar4 = Range<unsigned_char>::start((Range<unsigned_char> *)local_48);
                uVar5 = Range<unsigned_char>::end((Range<unsigned_char> *)local_68);
                Range<unsigned_char>::Range(&local_f8,uVar4,uVar5);
                append(pvVar6,&local_f8);
                Range<unsigned_char>::~Range(&local_f8);
                p_Var7 = __gnu_cxx::
                         __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                         ::operator++(&j);
                local_100._M_current =
                     (Range<unsigned_char> *)
                     std::
                     vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                     ::cend(&this->m_ranges);
                bVar1 = __gnu_cxx::operator!=(p_Var7,&local_100);
                if (bVar1) {
                  pRVar8 = __gnu_cxx::
                           __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                           ::operator*(&j);
                  Range<unsigned_char>::operator=((Range<unsigned_char> *)local_48,pRVar8);
                }
                p_Var7 = __gnu_cxx::
                         __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                         ::operator++((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                       *)&ri.m_start);
                local_108._M_current =
                     (Range<unsigned_char> *)
                     std::
                     vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                     ::cend(&cc->m_ranges);
                bVar1 = __gnu_cxx::operator!=(p_Var7,&local_108);
                if (bVar1) {
                  pRVar8 = __gnu_cxx::
                           __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                           ::operator*((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                        *)&ri.m_start);
                  Range<unsigned_char>::operator=((Range<unsigned_char> *)local_68,pRVar8);
                }
              }
            }
          }
        }
      }
    }
  }
  while( true ) {
    local_110._M_current =
         (Range<unsigned_char> *)
         std::
         vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ::cend(&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&j,&local_110);
    if (!bVar1) break;
    pvVar6 = std::array<Centaurus::CharClass<unsigned_char>,_3UL>::operator[]
                       (__return_storage_ptr__,0);
    append(pvVar6,(Range<unsigned_char> *)local_48);
    p_Var7 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator++(&j);
    local_118._M_current =
         (Range<unsigned_char> *)
         std::
         vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ::cend(&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(p_Var7,&local_118);
    if (bVar1) {
      pRVar8 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
               ::operator*(&j);
      Range<unsigned_char>::operator=((Range<unsigned_char> *)local_48,pRVar8);
    }
  }
  while( true ) {
    local_120._M_current =
         (Range<unsigned_char> *)
         std::
         vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ::cend(&cc->m_ranges);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                        *)&ri.m_start,&local_120);
    if (!bVar1) break;
    pvVar6 = std::array<Centaurus::CharClass<unsigned_char>,_3UL>::operator[]
                       (__return_storage_ptr__,1);
    append(pvVar6,(Range<unsigned_char> *)local_68);
    p_Var7 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator++((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                           *)&ri.m_start);
    local_128._M_current =
         (Range<unsigned_char> *)
         std::
         vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ::cend(&cc->m_ranges);
    bVar1 = __gnu_cxx::operator!=(p_Var7,&local_128);
    if (bVar1) {
      pRVar8 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
               ::operator*((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                            *)&ri.m_start);
      Range<unsigned_char>::operator=((Range<unsigned_char> *)local_68,pRVar8);
    }
  }
  Range<unsigned_char>::~Range((Range<unsigned_char> *)local_68);
  Range<unsigned_char>::~Range((Range<unsigned_char> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::array<CharClass<TCHAR>, 3> diff_and_int(const CharClass<TCHAR>& cc) const
    {
        //Returns 3 character classes
        //ret[0] => *this & ~cc
        //ret[1] => ~(*this) & cc
        //ret[2] => *this & cc
        std::array<CharClass<TCHAR>, 3> ret;

        auto i = m_ranges.cbegin();
        auto j = cc.m_ranges.cbegin();
        
        Range<TCHAR> ri, rj;

        if (i != m_ranges.cend())
            ri = *i;
        if (j != cc.m_ranges.cend())
            rj = *j;

        while (i != m_ranges.cend() && j != cc.m_ranges.cend())
        {
            if (ri < rj)
            {
                ret[0].append(ri);
                if (++i != m_ranges.cend())
                    ri = *i;
            }
            else if (ri > rj)
            {
                ret[1].append(rj);
                if (++j != cc.m_ranges.cend())
                    rj = *j;
            }
            else
            {
                if (ri.start() < rj.start())
                {
                    //When ri begins earlier than rj
                    ret[0].append(Range<TCHAR>(ri.start(), rj.start()));
                    ri.start(rj.start());
                }
                else if (rj.start() < ri.start())
                {
                    //When rj begins earlier than ri
                    ret[1].append(Range<TCHAR>(rj.start(), ri.start()));
                    rj.start(ri.start());
                }
                else
                {
                    //ri.start() == rj.start()
                    if (ri.end() > rj.end())
                    {
                        //When ri ends later than rj
                        ret[2].append(Range<TCHAR>(rj.start(), rj.end()));
                        ri.start(rj.end());
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                    else if (ri.end() < rj.end())
                    {
                        //When rj ends later than ri
                        ret[2].append(Range<TCHAR>(ri.start(), ri.end()));
                        rj.start(ri.end());
                        if (++i != m_ranges.cend())
                            ri = *i;
                    }
                    else
                    {
                        //When ri equals to rj
                        ret[2].append(Range<TCHAR>(ri.start(), rj.end()));
                        if (++i != m_ranges.cend())
                            ri = *i;
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                }
            }
        }

        while (i != m_ranges.cend())
        {
            ret[0].append(ri);
            if (++i != m_ranges.cend())
                ri = *i;
        }
        while (j != cc.m_ranges.cend())
        {
            ret[1].append(rj);
            if (++j != cc.m_ranges.cend())
                rj = *j;
        }

        /*std::cout << ret[0] << std::endl;
        std::cout << ret[1] << std::endl;
        std::cout << ret[2] << std::endl;*/

        return ret;
    }